

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifAig.c
# Opt level: O0

Abc_Ntk_t * Io_BlifParse(Io_BlifMan_t *p)

{
  int iVar1;
  char *pcVar2;
  int local_2c;
  int i;
  char *pLine;
  Abc_Ntk_t *pAig;
  Io_BlifMan_t *p_local;
  
  iVar1 = Io_BlifParseModel(p,p->pModel);
  if (iVar1 == 0) {
    p_local = (Io_BlifMan_t *)0x0;
  }
  else {
    for (local_2c = 0; iVar1 = Vec_PtrSize(p->vInputs), local_2c < iVar1; local_2c = local_2c + 1) {
      pcVar2 = (char *)Vec_PtrEntry(p->vInputs,local_2c);
      iVar1 = Io_BlifParseInputs(p,pcVar2);
      if (iVar1 == 0) {
        return (Abc_Ntk_t *)0x0;
      }
    }
    for (local_2c = 0; iVar1 = Vec_PtrSize(p->vOutputs), local_2c < iVar1; local_2c = local_2c + 1)
    {
      pcVar2 = (char *)Vec_PtrEntry(p->vOutputs,local_2c);
      iVar1 = Io_BlifParseOutputs(p,pcVar2);
      if (iVar1 == 0) {
        return (Abc_Ntk_t *)0x0;
      }
    }
    for (local_2c = 0; iVar1 = Vec_PtrSize(p->vLatches), local_2c < iVar1; local_2c = local_2c + 1)
    {
      pcVar2 = (char *)Vec_PtrEntry(p->vLatches,local_2c);
      iVar1 = Io_BlifParseLatch(p,pcVar2);
      if (iVar1 == 0) {
        return (Abc_Ntk_t *)0x0;
      }
    }
    for (local_2c = 0; iVar1 = Vec_PtrSize(p->vNames), local_2c < iVar1; local_2c = local_2c + 1) {
      pcVar2 = (char *)Vec_PtrEntry(p->vNames,local_2c);
      iVar1 = Io_BlifParseNames(p,pcVar2);
      if (iVar1 == 0) {
        return (Abc_Ntk_t *)0x0;
      }
    }
    iVar1 = Io_BlifParseConstruct(p);
    if (iVar1 == 0) {
      p_local = (Io_BlifMan_t *)0x0;
    }
    else {
      p_local = (Io_BlifMan_t *)p->pAig;
      p->pAig = (Abc_Ntk_t *)0x0;
    }
  }
  return (Abc_Ntk_t *)p_local;
}

Assistant:

static Abc_Ntk_t * Io_BlifParse( Io_BlifMan_t * p )
{
    Abc_Ntk_t * pAig;
    char * pLine;
    int i;
    // parse the model
    if ( !Io_BlifParseModel( p, p->pModel ) )
        return NULL;
    // parse the inputs
    Vec_PtrForEachEntry( char *, p->vInputs, pLine, i )
        if ( !Io_BlifParseInputs( p, pLine ) )
            return NULL;
    // parse the outputs
    Vec_PtrForEachEntry( char *, p->vOutputs, pLine, i )
        if ( !Io_BlifParseOutputs( p, pLine ) )
            return NULL;
    // parse the latches
    Vec_PtrForEachEntry( char *, p->vLatches, pLine, i )
        if ( !Io_BlifParseLatch( p, pLine ) )
            return NULL;
    // parse the nodes
    Vec_PtrForEachEntry( char *, p->vNames, pLine, i )
        if ( !Io_BlifParseNames( p, pLine ) )
            return NULL;
    // reconstruct the network from the parsed data
    if ( !Io_BlifParseConstruct( p ) )
        return NULL;
    // return the network
    pAig = p->pAig;
    p->pAig = NULL;
    return pAig;
}